

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix3 * matrix3_make_transformation_rotationf_z(matrix3 *m,float angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos((double)angle);
  dVar2 = sin((double)angle);
  (m->field_0).m[2] = 0.0;
  (m->field_0).m[4] = 1.0;
  *(undefined8 *)((long)&m->field_0 + 0x18) = 0;
  (m->field_0).m[8] = 1.0;
  (m->field_0).m[0] = (float)dVar1;
  (m->field_0).m[1] = (float)dVar2;
  (m->field_0).m[3] = -(float)dVar2;
  (m->field_0).m[5] = (float)dVar1;
  return m;
}

Assistant:

HYPAPI struct matrix3 *matrix3_make_transformation_rotationf_z(struct matrix3 *m, HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	matrix3_identity(m);

	m->r00 = c;
	m->r01 = s;
	m->r10 = -s;
	m->r12 = c;

	return m;
}